

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O2

int intglobal(void)

{
  symboltype sVar1;
  int iVar2;
  int iVar3;
  addressrec *paVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  quadtype *pqVar10;
  quadtype *pqVar11;
  
  pqVar11 = intcode;
  uVar6 = 0;
  iVar9 = numcodes;
  do {
    pqVar11 = pqVar11 + 1;
    if ((long)iVar9 <= (long)uVar6) {
      iVar2 = 1;
      for (lVar7 = 0; lVar7 < iVar9; lVar7 = lVar7 + 1) {
        if (intcode[lVar7].opcode == opassn) {
          sVar1 = symclass(intcode[lVar7].op1.opnd);
          iVar9 = numcodes;
          if (sVar1 == sttempvar) {
            iVar3 = 0;
            iVar8 = iVar2;
            while ((iVar8 < iVar9 && (iVar3 == 0))) {
              iVar3 = codeappears((int)lVar7,iVar8);
              iVar8 = iVar8 + 1;
            }
            if (iVar3 == 0) {
              intcode[lVar7].opcode = opnull;
            }
          }
        }
        iVar2 = iVar2 + 1;
      }
      packcode();
      return numcodes;
    }
    if (intcode[uVar6].opcode == opassn) {
      sVar1 = symclass(intcode[uVar6].op1.opnd);
      iVar9 = numcodes;
      if (sVar1 == sttempvar) {
        iVar2 = 0;
        uVar5 = uVar6;
        pqVar10 = pqVar11;
        while( true ) {
          iVar8 = (int)(uVar5 + 1);
          if (((iVar9 <= iVar8) || (oparg < pqVar10->opcode)) || (iVar2 != 0)) break;
          iVar2 = copyprop((int)uVar6,iVar8);
          pqVar10 = pqVar10 + 1;
          uVar5 = uVar5 + 1;
        }
        if (iVar2 == 2) {
          paVar4 = &intcode[uVar5 & 0xffffffff].op3;
        }
        else {
          if (iVar2 != 1) goto LAB_00107e97;
          paVar4 = &intcode[uVar5 & 0xffffffff].op2;
        }
        *paVar4 = intcode[uVar6].op2;
        intcode[uVar6].opcode = opnull;
      }
    }
LAB_00107e97:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int	intglobal(void)
{
    int	i, j, tempused, tempcopied;
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempcopied = 0;
            for (j = i + 1;  j < numcodes && insamebb(j)
                 && !tempcopied;  j++)
                tempcopied = copyprop(i, j);
            if (tempcopied == 1)	{
                intcode[j-1].op2 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
            else if (tempcopied == 2)	{
                intcode[j-1].op3 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
        }
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempused = 0;
            for (j = i + 1;  j < numcodes && !tempused;  j++)
                tempused = codeappears(i, j);
            if (!tempused)
                intcode[i].opcode = opnull;
        }
    packcode();
    
    return(numcodes);
}